

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void test_to<char>(char *s,uint codepoint)

{
  byte bVar1;
  bool bVar2;
  code_point cVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  ulong extraout_RAX;
  runtime_error *prVar7;
  int iVar8;
  uint uVar9;
  char *e;
  long lVar10;
  string local_60;
  char *local_40;
  uint local_34;
  
  lVar6 = 0;
  do {
    lVar10 = lVar6;
    lVar6 = lVar10 + 1;
  } while (s[lVar10] != '\0');
  test_counter = test_counter + 2;
  e = s + lVar10;
  local_40 = s;
  cVar3 = booster::locale::utf::utf_traits<char,1>::decode<char_const*>(&local_40,e);
  if (cVar3 != codepoint) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x51);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," tr::template decode<CharType const *>(begin,end) == codepoint",0x3e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar8 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar8;
    if (bVar2) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_60);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (codepoint != 0xffffffff) {
    test_counter = test_counter + 1;
    if (e != local_40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," end == begin",0xd);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    if (codepoint == 0xfffffffe) {
      test_counter = test_counter + 1;
      if (0x32 < (byte)(*s + 0x3eU) && *s != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x57);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," *s== 0 || 0 < tr::trail_length(*s)",0x23);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        iVar8 = error_counter + 1;
        bVar2 = 0x14 < error_counter;
        error_counter = iVar8;
        if (bVar2) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar7,&local_60);
          __cxa_throw(prVar7,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_to<char>();
      if ((extraout_RAX & 1) == 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  if (codepoint < 0xfffffffe) {
    test_counter = test_counter + 2;
    for (local_40 = s + 1; local_34 = codepoint, e != local_40; local_40 = local_40 + 1) {
      test_counter = test_counter + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x61);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," tr::is_trail(*begin)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (0x14 < error_counter) {
        error_counter = error_counter + 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
      test_counter = test_counter + 1;
      error_counter = error_counter + 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x62);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," !tr::is_lead(*begin)",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (0x14 < error_counter) {
        error_counter = error_counter + 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
      codepoint = local_34;
      error_counter = error_counter + 1;
    }
    test_counter = test_counter + 1;
    lVar6 = 1;
    if ((0x7f < codepoint) && (lVar6 = 2, 0x7ff < codepoint)) {
      lVar6 = 4 - (ulong)(codepoint < 0x10000);
    }
    if (lVar6 + 1 != lVar10 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x65);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," tr::width(codepoint)==end - s",0x1e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    bVar1 = *s;
    uVar4 = 0;
    uVar9 = 0;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xc2) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = 1;
        if ((0xdf < bVar1) && (uVar9 = 2, 0xef < bVar1)) {
          uVar9 = (bVar1 < 0xf5) - 1 | 3;
        }
      }
    }
    if ((0x7f < codepoint) && (uVar4 = 1, 0x7ff < codepoint)) {
      uVar4 = 3 - (codepoint < 0x10000);
    }
    if (uVar9 != uVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x66);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," tr::trail_length(*s) == tr::width(codepoint) - 1",0x31);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    local_40 = s;
    cVar3 = booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(&local_40);
    if (cVar3 != codepoint) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," tr::decode_valid(begin) == codepoint",0x25);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    if (e != local_40) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x69);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," begin == end",0xd);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar8 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar8;
      if (bVar2) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar7,&local_60);
        __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  return;
}

Assistant:

void test_to(CharType const *s,unsigned codepoint)
{
    CharType const *begin = s;
    CharType const *end = begin;

    while(*end)
        end++;

    typedef utf_traits<CharType> tr;
    
    TEST(tr::max_width == 4 / sizeof(CharType));

    TEST(tr::template decode<CharType const *>(begin,end) == codepoint);

    if(codepoint == incomplete || codepoint != illegal)
        TEST(end == begin);

    if(codepoint == incomplete) {
        TEST(*s== 0 || 0 < tr::trail_length(*s));
        TEST(tr::trail_length(*s) + 1 > end - s);
    }

    if(codepoint != incomplete && codepoint != illegal) {
        begin=s;
        TEST(tr::is_lead(*begin));
        TEST(!tr::is_trail(*begin));
        begin++;
        while(begin!=end) {
            TEST(tr::is_trail(*begin));
            TEST(!tr::is_lead(*begin));
            begin++;
        }
        TEST(tr::width(codepoint)==end - s);
        TEST(tr::trail_length(*s) == tr::width(codepoint) - 1);
        begin = s;
        TEST(tr::decode_valid(begin) == codepoint);
        TEST(begin == end);
    }
}